

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int bid_keyword_list(char *p,ssize_t len,int unset,int last_is_path)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar2;
  bool bVar3;
  int value;
  int blank;
  int keycnt;
  int l;
  int local_28;
  char *local_10;
  
  local_28 = 0;
  local_10 = in_RDI;
  while( true ) {
    bVar2 = false;
    if (0 < (long)in_RSI) {
      bVar2 = *local_10 != '\0';
    }
    if (!bVar2) {
      return local_28;
    }
    bVar2 = false;
    while( true ) {
      bVar3 = false;
      if ((0 < (long)in_RSI) && (bVar3 = true, *local_10 != ' ')) {
        bVar3 = *local_10 == '\t';
      }
      if (!bVar3) break;
      local_10 = local_10 + 1;
      in_RSI = in_RSI + -1;
      bVar2 = true;
    }
    if (*local_10 == '\n') {
      return local_28;
    }
    if (*local_10 == '\r') {
      return local_28;
    }
    if (*local_10 == '\\') {
      if (local_10[1] == '\n') {
        return local_28;
      }
      if (local_10[1] == '\r') {
        return local_28;
      }
    }
    if ((!bVar2) && (in_ECX == 0)) {
      return -1;
    }
    if ((in_ECX != 0) && (in_RSI == (char *)0x0)) break;
    if ((in_EDX != 0) && (iVar1 = bid_keycmp(local_10,"all",(ssize_t)in_RSI), 0 < iVar1)) {
      return 1;
    }
    iVar1 = bid_keyword(in_RSI,CONCAT44(in_EDX,in_ECX));
    if (iVar1 == 0) {
      return -1;
    }
    local_10 = local_10 + iVar1;
    in_RSI = in_RSI + -(long)iVar1;
    local_28 = local_28 + 1;
    if (*local_10 == '=') {
      bVar2 = false;
      while( true ) {
        local_10 = local_10 + 1;
        in_RSI = in_RSI + -1;
        bVar3 = false;
        if ((0 < (long)in_RSI) && (bVar3 = false, *local_10 != ' ')) {
          bVar3 = *local_10 != '\t';
        }
        if (!bVar3) break;
        bVar2 = true;
      }
      if ((in_EDX == 0) && (!bVar2)) {
        return -1;
      }
    }
  }
  return local_28;
}

Assistant:

static int
bid_keyword_list(const char *p,  ssize_t len, int unset, int last_is_path)
{
	int l;
	int keycnt = 0;

	while (len > 0 && *p) {
		int blank = 0;

		/* Test whether there are blank characters in the line. */
		while (len >0 && (*p == ' ' || *p == '\t')) {
			++p;
			--len;
			blank = 1;
		}
		if (*p == '\n' || *p == '\r')
			break;
		if (p[0] == '\\' && (p[1] == '\n' || p[1] == '\r'))
			break;
		if (!blank && !last_is_path) /* No blank character. */
			return (-1);
		if (last_is_path && len == 0)
				return (keycnt);

		if (unset) {
			l = bid_keycmp(p, "all", len);
			if (l > 0)
				return (1);
		}
		/* Test whether there is a correct key in the line. */
		l = bid_keyword(p, len);
		if (l == 0)
			return (-1);/* Unknown keyword was found. */
		p += l;
		len -= l;
		keycnt++;

		/* Skip value */
		if (*p == '=') {
			int value = 0;
			++p;
			--len;
			while (len > 0 && *p != ' ' && *p != '\t') {
				++p;
				--len;
				value = 1;
			}
			/* A keyword should have a its value unless
			 * "/unset" operation. */ 
			if (!unset && value == 0)
				return (-1);
		}
	}
	return (keycnt);
}